

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fruit.cpp
# Opt level: O0

Banana * __thiscall L13_4::Banana::operator=(Banana *this,Banana *b)

{
  size_t sVar1;
  char *pcVar2;
  Banana *b_local;
  Banana *this_local;
  
  if (this != b) {
    Fruit::operator=(&this->super_Fruit,&b->super_Fruit);
    if (this->_style != (char *)0x0) {
      operator_delete__(this->_style);
    }
    sVar1 = strlen(b->_style);
    pcVar2 = (char *)operator_new__(sVar1 + 1);
    this->_style = pcVar2;
    strcpy(this->_style,b->_style);
  }
  return this;
}

Assistant:

Banana& Banana::operator=(const Banana &b) {
        if (this == &b) {
            return *this;
        }
        //  这里需要调用一下基类的 重载赋值运算符
        Fruit::operator=(b);
        delete [] _style;
        _style = new char[std::strlen(b._style) + 1];
        std::strcpy(_style, b._style);
        return *this;
    }